

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetView.cpp
# Opt level: O0

void __thiscall OffsetView::OffsetView(OffsetView *this,float viewDivisor,View *view)

{
  View *in_RSI;
  OffsetView *in_RDI;
  float in_XMM0_Da;
  Vector2f *size;
  undefined4 in_stack_fffffffffffffff0;
  
  ((Vector2f *)&in_RDI->viewDivisor_)->x = in_XMM0_Da;
  sf::View::View((View *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0));
  sf::Vector2<int>::Vector2(&in_RDI->centerOffset_);
  size = &(in_RDI->view_).m_center;
  sf::View::getSize(in_RSI);
  sf::View::setSize((View *)in_RDI,size);
  sf::View::getCenter(in_RSI);
  setCenter(in_RDI,size);
  return;
}

Assistant:

OffsetView::OffsetView(float viewDivisor, const sf::View& view) :
    viewDivisor_(viewDivisor),
    view_(),
    centerOffset_() {

    view_.setSize(view.getSize());
    setCenter(view.getCenter());
}